

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

obj * restore_obj(memfile *mf)

{
  uchar uVar1;
  int8_t iVar2;
  int16_t iVar3;
  int32_t iVar4;
  uint uVar5;
  monst *oextra_src;
  uint mid;
  int monlen;
  monst *mtmp;
  obj *otmp;
  char namelen;
  uint oflags;
  memfile *mf_local;
  
  mfmagic_check(mf,0x4a424f);
  iVar4 = mread32(mf);
  uVar1 = (uchar)iVar4;
  mtmp = (monst *)malloc((ulong)(uint)(int)(char)uVar1 + 0x68);
  memset(mtmp,0,(long)(char)uVar1 + 0x68);
  uVar5 = mread32(mf);
  *(uint *)&mtmp->minvent = uVar5;
  uVar5 = mread32(mf);
  mtmp->mhp = uVar5;
  iVar4 = mread32(mf);
  mtmp->mhpmax = iVar4;
  iVar4 = mread32(mf);
  *(int32_t *)&mtmp->my = iVar4;
  uVar5 = mread32(mf);
  *(uint *)&mtmp->movement = uVar5;
  uVar5 = mread32(mf);
  mtmp->mappearance = uVar5;
  iVar4 = mread32(mf);
  *(int32_t *)&mtmp->field_0x60 = iVar4;
  uVar5 = mread32(mf);
  iVar3 = mread16(mf);
  *(int16_t *)((long)&mtmp->m_id + 2) = iVar3;
  iVar2 = mread8(mf);
  *(int8_t *)&mtmp->m_id = iVar2;
  iVar2 = mread8(mf);
  *(int8_t *)((long)&mtmp->m_id + 1) = iVar2;
  iVar2 = mread8(mf);
  *(int8_t *)&mtmp->mspec_used = iVar2;
  iVar2 = mread8(mf);
  *(int8_t *)((long)&mtmp->mspec_used + 1) = iVar2;
  iVar2 = mread8(mf);
  *(int8_t *)((long)&mtmp->mspec_used + 2) = iVar2;
  iVar2 = mread8(mf);
  *(int8_t *)((long)&mtmp->mspec_used + 3) = iVar2;
  iVar4 = mread32(mf);
  mtmp->mtrapseen = (int)(long)iVar4;
  mtmp->mlstmv = (int)((ulong)(long)iVar4 >> 0x20);
  iVar4 = mread32(mf);
  *(long *)&mtmp->mstrategy = (long)iVar4;
  iVar2 = mread8(mf);
  mtmp->mtrack[2].x = iVar2;
  iVar2 = mread8(mf);
  mtmp->mtrack[2].y = iVar2;
  iVar2 = mread8(mf);
  mtmp->dlevel = (level *)(ulong)(iVar2 != '\0');
  mtmp->mtame = uVar1;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfffffffe | uVar5 >> 0x1f;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfffffffd | (uVar5 >> 0x1e & 1) << 1;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfffffffb | (uVar5 >> 0x1d & 1) << 2;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfffffff7 | (uVar5 >> 0x1c & 1) << 3;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xffffffef | (uVar5 >> 0x1b & 1) << 4;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xffffffdf | (uVar5 >> 0x1a & 1) << 5;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xffffffbf | (uVar5 >> 0x19 & 1) << 6;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xffffff7f | (uVar5 >> 0x18 & 1) << 7;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfffffcff | (uVar5 >> 0x16 & 3) << 8;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfffff3ff | (uVar5 >> 0x14 & 3) << 10
  ;
  *(uint *)(mtmp->mtrack + 3) =
       *(uint *)(mtmp->mtrack + 3) & 0xffffefff | (uVar5 >> 0x13 & 1) << 0xc;
  *(uint *)(mtmp->mtrack + 3) =
       *(uint *)(mtmp->mtrack + 3) & 0xffffdfff | (uVar5 >> 0x12 & 1) << 0xd;
  *(uint *)(mtmp->mtrack + 3) =
       *(uint *)(mtmp->mtrack + 3) & 0xffffbfff | (uVar5 >> 0x11 & 1) << 0xe;
  *(uint *)(mtmp->mtrack + 3) =
       *(uint *)(mtmp->mtrack + 3) & 0xffff7fff | (uVar5 >> 0x10 & 1) << 0xf;
  *(uint *)(mtmp->mtrack + 3) =
       *(uint *)(mtmp->mtrack + 3) & 0xfff8ffff | (uVar5 >> 0xd & 7) << 0x10;
  *(uint *)(mtmp->mtrack + 3) =
       *(uint *)(mtmp->mtrack + 3) & 0xfff7ffff | (uVar5 >> 0xc & 1) << 0x13;
  *(uint *)(mtmp->mtrack + 3) =
       *(uint *)(mtmp->mtrack + 3) & 0xffefffff | (uVar5 >> 0xb & 1) << 0x14;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xff9fffff | (uVar5 >> 9 & 3) << 0x15;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xff7fffff | (uVar5 >> 8 & 1) << 0x17;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfeffffff | (uVar5 >> 7 & 1) << 0x18;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfdffffff | (uVar5 >> 6 & 1) << 0x19;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfbffffff | (uVar5 >> 5 & 1) << 0x1a;
  *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xf7ffffff | (uVar5 >> 4 & 1) << 0x1b;
  if (mtmp->mtame != '\0') {
    mread(mf,(void *)((long)(mtmp->mtrack + 0x10) + (long)(int)*(short *)&mtmp->mfrozen),
          (uint)(byte)mtmp->mtame);
  }
  if ((*(uint *)(mtmp->mtrack + 3) >> 0x15 & 3) == 1) {
    oextra_src = restore_mon(mf);
    mtmp = (monst *)realloc_obj((obj *)mtmp,oextra_src->mnamelth + 0x78 + (int)oextra_src->mxlth,
                                oextra_src,(uint)(byte)mtmp->mtame,
                                (char *)((long)(mtmp->mtrack + 0x10) +
                                        (long)(int)*(short *)&mtmp->mfrozen));
    free(oextra_src);
  }
  else if ((*(uint *)(mtmp->mtrack + 3) >> 0x15 & 3) == 2) {
    uVar5 = mread32(mf);
    mtmp = (monst *)obj_attach_mid((obj *)mtmp,uVar5);
  }
  return (obj *)mtmp;
}

Assistant:

struct obj *restore_obj(struct memfile *mf)
{
    unsigned int oflags;
    char namelen;
    struct obj *otmp;
    
    mfmagic_check(mf, OBJ_MAGIC);
    
    namelen = mread32(mf);
    otmp = newobj(namelen);
    memset(otmp, 0, namelen + sizeof(struct obj));
    
    otmp->o_id = mread32(mf);
    otmp->owt = mread32(mf);
    otmp->quan = mread32(mf);
    otmp->corpsenm = mread32(mf);
    otmp->oeaten = mread32(mf);
    otmp->age = mread32(mf);
    otmp->owornmask = mread32(mf);
    oflags = mread32(mf);
    
    otmp->otyp = mread16(mf);
    
    otmp->ox = mread8(mf);
    otmp->oy = mread8(mf);
    otmp->spe = mread8(mf);
    otmp->oclass = mread8(mf);
    otmp->invlet = mread8(mf);
    otmp->oartifact = mread8(mf);
    otmp->oprops = mread32(mf);
    otmp->oprops_known = mread32(mf);
    otmp->where = mread8(mf);
    otmp->timed = mread8(mf);
    otmp->cobj = mread8(mf) ? (void*)1 : NULL; /* set the pointer to 1 if there will be contents */
    otmp->onamelth = namelen;
    
    otmp->cursed	= (oflags >> 31) & 1;
    otmp->blessed	= (oflags >> 30) & 1;
    otmp->unpaid	= (oflags >> 29) & 1;
    otmp->no_charge	= (oflags >> 28) & 1;
    otmp->known 	= (oflags >> 27) & 1;
    otmp->dknown	= (oflags >> 26) & 1;
    otmp->bknown	= (oflags >> 25) & 1;
    otmp->rknown	= (oflags >> 24) & 1;
    otmp->oeroded	= (oflags >> 22) & 3;
    otmp->oeroded2	= (oflags >> 20) & 3;
    otmp->oerodeproof	= (oflags >> 19) & 1;
    otmp->olocked	= (oflags >> 18) & 1;
    otmp->obroken	= (oflags >> 17) & 1;
    otmp->otrapped	= (oflags >> 16) & 1;
    otmp->recharged	= (oflags >> 13) & 7;
    otmp->lamplit	= (oflags >> 12) & 1;
    otmp->greased	= (oflags >> 11) & 1;
    otmp->oattached	= (oflags >>  9) & 3;
    otmp->in_use	= (oflags >>  8) & 1;
    otmp->was_dropped	= (oflags >>  7) & 1;
    otmp->was_thrown	= (oflags >>  6) & 1;
    otmp->bypass	= (oflags >>  5) & 1;
    otmp->odrained	= (oflags >>  4) & 1;
    
    if (otmp->onamelth)
	mread(mf, ONAME(otmp), otmp->onamelth);
    
    if (otmp->oattached == OATTACHED_MONST) {
	struct monst *mtmp = restore_mon(mf);
	int monlen = sizeof(struct monst) + mtmp->mnamelth + mtmp->mxlth;
	otmp = realloc_obj(otmp, monlen, mtmp, otmp->onamelth, ONAME(otmp));
	dealloc_monst(mtmp);
    } else if (otmp->oattached == OATTACHED_M_ID) {
	unsigned int mid = mread32(mf);
	otmp = obj_attach_mid(otmp, mid);
    }
    
    return otmp;
}